

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O2

string_view RenX::translateWinTypePlain(WinType winType)

{
  size_t *psVar1;
  undefined **ppuVar2;
  string_view sVar3;
  
  if (winType < Unknown) {
    psVar1 = (size_t *)(&PTR__ZL28scoreWinTypePlainTranslation_0_00165198)[winType];
    ppuVar2 = (undefined **)(&PTR__ZL28scoreWinTypePlainTranslation_1_001651c8)[winType];
  }
  else {
    ppuVar2 = &_ZL30unknownWinTypePlainTranslation_1;
    psVar1 = &_ZL30unknownWinTypePlainTranslation_0;
  }
  sVar3._M_str = *ppuVar2;
  sVar3._M_len = *psVar1;
  return sVar3;
}

Assistant:

std::string_view RenX::translateWinTypePlain(RenX::WinType winType)
{
	switch (winType)
	{
	case RenX::WinType::Score:
		return scoreWinTypePlainTranslation;
	case RenX::WinType::Base:
		return baseWinTypePlainTranslation;
	case RenX::WinType::Beacon:
		return beaconWinTypePlainTranslation;
	case RenX::WinType::Tie:
		return tieWinTypePlainTranslation;
	case RenX::WinType::Shutdown:
		return shutdownWinTypePlainTranslation;
	case RenX::WinType::Surrender:
		return surrenderWinTypePlainTranslation;
	case RenX::WinType::Unknown:
	default:
		return unknownWinTypePlainTranslation;
	}
}